

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

size_t ma_dr_wav__write_or_count_string_to_fixed_size_buf
                 (ma_dr_wav *pWav,char *str,size_t bufFixedSize)

{
  ulong uVar1;
  ulong in_RAX;
  long lVar2;
  ulong uVar3;
  undefined8 uStack_28;
  
  if (pWav != (ma_dr_wav *)0x0) {
    uVar3 = 0;
    if ((bufFixedSize != 0) && (*str != '\0')) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (str[uVar3] == '\0') break;
        uVar1 = uVar3 + 1;
      } while (uVar3 < bufFixedSize);
    }
    uStack_28 = in_RAX;
    (*pWav->onWrite)(pWav->pUserData,str,uVar3);
    lVar2 = bufFixedSize - uVar3;
    if (uVar3 <= bufFixedSize && lVar2 != 0) {
      do {
        uStack_28 = uStack_28 & 0xffffffffffffff;
        (*pWav->onWrite)(pWav->pUserData,(void *)((long)&uStack_28 + 7),1);
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
  }
  return bufFixedSize;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__write_or_count_string_to_fixed_size_buf(ma_dr_wav* pWav, char* str, size_t bufFixedSize)
{
    size_t len;
    if (pWav == NULL) {
        return bufFixedSize;
    }
    len = ma_dr_wav__strlen_clamped(str, bufFixedSize);
    ma_dr_wav__write_or_count(pWav, str, len);
    if (len < bufFixedSize) {
        size_t i;
        for (i = 0; i < bufFixedSize - len; ++i) {
            ma_dr_wav__write_byte(pWav, 0);
        }
    }
    return bufFixedSize;
}